

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O2

int __thiscall
chrono::ChLinkDistance::Initialize
          (ChLinkDistance *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpos1,
          ChVector<double> *mpos2,bool auto_distance,double mdistance)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined3 in_register_00000009;
  double dVar4;
  double dVar5;
  ChVector<double> v;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  
  peVar1 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->super_ChLink).Body1 = peVar1;
  (this->super_ChLink).Body2 =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = (*(peVar1->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->Cx,(ChVariables *)CONCAT44(extraout_var,iVar2),
             (ChVariables *)CONCAT44(extraout_var_00,iVar3));
  if (CONCAT31(in_register_00000009,pos_are_relative) == 0) {
    ChFrame<double>::TransformPointParentToLocal
              (&v,(ChFrame<double> *)(this->super_ChLink).Body1,mpos1);
    if (&v != &this->pos1) {
      (this->pos1).m_data[0] = v.m_data[0];
      (this->pos1).m_data[1] = v.m_data[1];
      (this->pos1).m_data[2] = v.m_data[2];
    }
    ChFrame<double>::TransformPointParentToLocal
              (&v,(ChFrame<double> *)(this->super_ChLink).Body2,mpos2);
    if (&v == &this->pos2) goto LAB_00abea0b;
    (this->pos2).m_data[0] = v.m_data[0];
    (this->pos2).m_data[1] = v.m_data[1];
  }
  else {
    if (&this->pos1 != mpos1) {
      (this->pos1).m_data[0] = mpos1->m_data[0];
      (this->pos1).m_data[1] = mpos1->m_data[1];
      (this->pos1).m_data[2] = mpos1->m_data[2];
    }
    if (&this->pos2 == mpos2) goto LAB_00abea0b;
    (this->pos2).m_data[0] = mpos2->m_data[0];
    (this->pos2).m_data[1] = mpos2->m_data[1];
    v.m_data[2] = mpos2->m_data[2];
  }
  (this->pos2).m_data[2] = v.m_data[2];
LAB_00abea0b:
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)local_48,(ChFrame<double> *)(this->super_ChLink).Body1,&this->pos1)
  ;
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)local_68,(ChFrame<double> *)(this->super_ChLink).Body2,&this->pos2)
  ;
  v.m_data._0_16_ = vsubpd_avx(local_48,local_68);
  v.m_data[2] = local_38 - local_58;
  dVar5 = ChVector<double>::Length(&v);
  this->curr_dist = dVar5;
  dVar4 = (double)((ulong)auto_distance * (long)dVar5 + (ulong)!auto_distance * (long)mdistance);
  this->distance = dVar4;
  (this->C).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       dVar5 - dVar4;
  return 1;
}

Assistant:

int ChLinkDistance::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                               std::shared_ptr<ChBodyFrame> mbody2,
                               bool pos_are_relative,
                               ChVector<> mpos1,
                               ChVector<> mpos2,
                               bool auto_distance,
                               double mdistance) {
    Body1 = mbody1.get();
    Body2 = mbody2.get();
    Cx.SetVariables(&Body1->Variables(), &Body2->Variables());

    if (pos_are_relative) {
        pos1 = mpos1;
        pos2 = mpos2;
    } else {
        pos1 = Body1->TransformPointParentToLocal(mpos1);
        pos2 = Body2->TransformPointParentToLocal(mpos2);
    }

    ChVector<> AbsDist = Body1->TransformPointLocalToParent(pos1) - Body2->TransformPointLocalToParent(pos2);
    curr_dist = AbsDist.Length();

    if (auto_distance) {
        distance = curr_dist;
    } else {
        distance = mdistance;
    }

    C[0] = curr_dist - distance;

    return true;
}